

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int combine_outputs(wally_psbt_output *dst,wally_psbt_output *src)

{
  uchar *puVar1;
  int local_24;
  int ret;
  wally_psbt_output *src_local;
  wally_psbt_output *dst_local;
  
  dst_local._4_4_ = map_extend(&dst->keypaths,&src->keypaths,wally_ec_public_key_verify);
  if ((dst_local._4_4_ == 0) &&
     (dst_local._4_4_ = map_extend(&dst->unknowns,&src->unknowns,(_func_int_uchar_ptr_size_t *)0x0),
     dst_local._4_4_ == 0)) {
    local_24 = 0;
    if ((dst->redeem_script == (uchar *)0x0) && (src->redeem_script != (uchar *)0x0)) {
      if ((src->redeem_script == (uchar *)0x0) || (src->redeem_script_len != 0)) {
        local_24 = wally_psbt_output_set_redeem_script
                             (dst,src->redeem_script,src->redeem_script_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->redeem_script = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->witness_script == (uchar *)0x0) && (src->witness_script != (uchar *)0x0)) {
      if ((src->witness_script == (uchar *)0x0) || (src->witness_script_len != 0)) {
        local_24 = wally_psbt_output_set_witness_script
                             (dst,src->witness_script,src->witness_script_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->witness_script = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->blinding_pubkey == (uchar *)0x0) && (src->blinding_pubkey != (uchar *)0x0)) {
      if ((src->blinding_pubkey == (uchar *)0x0) || (src->blinding_pubkey_len != 0)) {
        local_24 = wally_psbt_output_set_blinding_pubkey
                             (dst,src->blinding_pubkey,src->blinding_pubkey_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->blinding_pubkey = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->value_commitment == (uchar *)0x0) && (src->value_commitment != (uchar *)0x0)) {
      if ((src->value_commitment == (uchar *)0x0) || (src->value_commitment_len != 0)) {
        local_24 = wally_psbt_output_set_value_commitment
                             (dst,src->value_commitment,src->value_commitment_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->value_commitment = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->vbf == (uchar *)0x0) && (src->vbf != (uchar *)0x0)) {
      if ((src->vbf == (uchar *)0x0) || (src->vbf_len != 0)) {
        local_24 = wally_psbt_output_set_vbf(dst,src->vbf,src->vbf_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->vbf = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->asset_commitment == (uchar *)0x0) && (src->asset_commitment != (uchar *)0x0)) {
      if ((src->asset_commitment == (uchar *)0x0) || (src->asset_commitment_len != 0)) {
        local_24 = wally_psbt_output_set_asset_commitment
                             (dst,src->asset_commitment,src->asset_commitment_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->asset_commitment = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->abf == (uchar *)0x0) && (src->abf != (uchar *)0x0)) {
      if ((src->abf == (uchar *)0x0) || (src->abf_len != 0)) {
        local_24 = wally_psbt_output_set_abf(dst,src->abf,src->abf_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->abf = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->nonce == (uchar *)0x0) && (src->nonce != (uchar *)0x0)) {
      if ((src->nonce == (uchar *)0x0) || (src->nonce_len != 0)) {
        local_24 = wally_psbt_output_set_nonce(dst,src->nonce,src->nonce_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->nonce = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->rangeproof == (uchar *)0x0) && (src->rangeproof != (uchar *)0x0)) {
      if ((src->rangeproof == (uchar *)0x0) || (src->rangeproof_len != 0)) {
        local_24 = wally_psbt_output_set_rangeproof(dst,src->rangeproof,src->rangeproof_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->rangeproof = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->surjectionproof == (uchar *)0x0) && (src->surjectionproof != (uchar *)0x0)) {
      if ((src->surjectionproof == (uchar *)0x0) || (src->surjectionproof_len != 0)) {
        local_24 = wally_psbt_output_set_surjectionproof
                             (dst,src->surjectionproof,src->surjectionproof_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->surjectionproof = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

static int combine_outputs(struct wally_psbt_output *dst,
                           const struct wally_psbt_output *src)
{
    int ret;

    if ((ret = map_extend(&dst->keypaths, &src->keypaths, wally_ec_public_key_verify)) != WALLY_OK)
        return ret;
    if ((ret = map_extend(&dst->unknowns, &src->unknowns, NULL)) != WALLY_OK)
        return ret;

    COMBINE_BYTES(output, redeem_script);
    COMBINE_BYTES(output, witness_script);

#ifdef BUILD_ELEMENTS
    COMBINE_BYTES(output, blinding_pubkey);
    COMBINE_BYTES(output, value_commitment);
    COMBINE_BYTES(output, vbf);
    COMBINE_BYTES(output, asset_commitment);
    COMBINE_BYTES(output, abf);
    COMBINE_BYTES(output, nonce);
    COMBINE_BYTES(output, rangeproof);
    COMBINE_BYTES(output, surjectionproof);
#endif
    return WALLY_OK;
}